

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::DeepTiledInputFile::initialize(DeepTiledInputFile *this)

{
  PixelType PVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  ostream *poVar6;
  ArgExc *pAVar7;
  TileDescription *pTVar8;
  LineOrder *pLVar9;
  long lVar10;
  size_type sVar11;
  value_type pTVar12;
  reference ppTVar13;
  Compressor *pCVar14;
  Channel *pCVar15;
  char *pcVar16;
  long in_RDI;
  TileOffsets *this_00;
  TileOffsets *this_01;
  stringstream _iex_throw_s_1;
  ConstIterator i_1;
  ChannelList *c;
  size_t i;
  Box2i *dataWindow;
  stringstream _iex_throw_s;
  undefined1 in_stack_000016ce;
  undefined1 in_stack_000016cf;
  Header *in_stack_000016d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  TileDescription *in_stack_fffffffffffffc10;
  TileBuffer *in_stack_fffffffffffffc20;
  int *in_stack_fffffffffffffc28;
  int *in_stack_fffffffffffffc30;
  int *in_stack_fffffffffffffc50;
  Header *in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  Compression c_00;
  TileOffsets *in_stack_fffffffffffffc70;
  stringstream local_378 [16];
  ostream local_368 [376];
  const_iterator local_1f0;
  const_iterator local_1e8;
  ChannelList *local_1e0;
  ulong local_1d8;
  Box2i *local_1a8;
  stringstream local_190 [16];
  ostream local_180 [384];
  
  if (*(int *)(*(long *)(in_RDI + 8) + 0x158) == -1) {
    Header::type_abi_cxx11_((Header *)0x1ce8a1);
    bVar3 = std::operator!=(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    if (bVar3) {
      pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar7,"Expected a deep tiled file but the file is not deep tiled.");
      __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  piVar5 = Header::version((Header *)0x1ce903);
  if (*piVar5 == 1) {
    Header::sanityCheck(in_stack_000016d0,(bool)in_stack_000016cf,(bool)in_stack_000016ce);
    pTVar8 = Header::tileDescription((Header *)0x1cea15);
    lVar10 = *(long *)(in_RDI + 8);
    *(undefined8 *)(lVar10 + 0x60) = *(undefined8 *)pTVar8;
    *(undefined8 *)(lVar10 + 0x68) = *(undefined8 *)&pTVar8->mode;
    pLVar9 = Header::lineOrder((Header *)0x1cea40);
    *(LineOrder *)(*(long *)(in_RDI + 8) + 0xe0) = *pLVar9;
    local_1a8 = Header::dataWindow((Header *)0x1cea64);
    *(int *)(*(long *)(in_RDI + 8) + 0xe4) = (local_1a8->min).x;
    *(int *)(*(long *)(in_RDI + 8) + 0xe8) = (local_1a8->max).x;
    *(int *)(*(long *)(in_RDI + 8) + 0xec) = (local_1a8->min).y;
    *(int *)(*(long *)(in_RDI + 8) + 0xf0) = (local_1a8->max).y;
    this_01 = (TileOffsets *)(*(long *)(in_RDI + 8) + 0x108);
    this_00 = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xf4);
    lVar10 = *(long *)(in_RDI + 8) + 0xf8;
    precalculateTileInfo
              (in_stack_fffffffffffffc10,(int)((ulong)lVar10 >> 0x20),(int)lVar10,
               (int)((ulong)this_00 >> 0x20),(int)this_00,(int **)this_01,
               (int **)in_stack_fffffffffffffc20,in_stack_fffffffffffffc28,in_stack_fffffffffffffc30
              );
    TileOffsets::TileOffsets
              (in_stack_fffffffffffffc70,(LevelMode)((ulong)in_stack_fffffffffffffc68 >> 0x20),
               (int)in_stack_fffffffffffffc68,(int)(in_stack_fffffffffffffc60 >> 0x20),
               (int *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc50);
    TileOffsets::operator=(this_00,this_01);
    TileOffsets::~TileOffsets((TileOffsets *)0x1cebac);
    local_1d8 = 0;
    while( true ) {
      uVar2 = local_1d8;
      sVar11 = std::
               vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
               ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                       *)(*(long *)(in_RDI + 8) + 0x170));
      c_00 = (Compression)((ulong)in_stack_fffffffffffffc68 >> 0x20);
      if (sVar11 <= uVar2) break;
      pTVar12 = (value_type)operator_new(0xa0);
      anon_unknown_8::TileBuffer::TileBuffer(in_stack_fffffffffffffc20);
      ppTVar13 = std::
                 vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                               *)(*(long *)(in_RDI + 8) + 0x170),local_1d8);
      *ppTVar13 = pTVar12;
      local_1d8 = local_1d8 + 1;
    }
    *(ulong *)(*(long *)(in_RDI + 8) + 0x1c8) =
         (ulong)(uint)(*(int *)(*(long *)(in_RDI + 8) + 100) *
                      *(int *)(*(long *)(in_RDI + 8) + 0x60)) << 2;
    Array<char>::resizeErase((Array<char> *)in_stack_fffffffffffffc10,lVar10);
    Header::compression((Header *)0x1ceccd);
    pCVar14 = newCompressor(c_00,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    *(Compressor **)(*(long *)(in_RDI + 8) + 0x1c0) = pCVar14;
    local_1e0 = Header::channels((Header *)0x1ced15);
    *(undefined4 *)(*(long *)(in_RDI + 8) + 0x1d0) = 0;
    local_1e8._M_node = (_Base_ptr)ChannelList::begin((ChannelList *)this_01);
    do {
      local_1f0._M_node = (_Base_ptr)ChannelList::end((ChannelList *)this_01);
      bVar3 = Imf_2_5::operator!=((ConstIterator *)this_00,(ConstIterator *)this_01);
      if (!bVar3) {
        return;
      }
      pCVar15 = ChannelList::ConstIterator::channel((ConstIterator *)0x1ced8b);
      PVar1 = pCVar15->type;
      if (PVar1 == UINT) {
        iVar4 = Xdr::size<unsigned_int>();
        *(int *)(*(long *)(in_RDI + 8) + 0x1d0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0x1d0);
      }
      else if (PVar1 == HALF) {
        iVar4 = Xdr::size<half>();
        *(int *)(*(long *)(in_RDI + 8) + 0x1d0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0x1d0);
      }
      else {
        if (PVar1 != FLOAT) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_378);
          poVar6 = std::operator<<(local_368,"Bad type for channel ");
          pcVar16 = ChannelList::ConstIterator::name((ConstIterator *)0x1cee55);
          poVar6 = std::operator<<(poVar6,pcVar16);
          std::operator<<(poVar6," initializing deepscanline reader");
          pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar7,local_378);
          __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        iVar4 = Xdr::size<float>();
        *(int *)(*(long *)(in_RDI + 8) + 0x1d0) = iVar4 + *(int *)(*(long *)(in_RDI + 8) + 0x1d0);
      }
      ChannelList::ConstIterator::operator++((ConstIterator *)this_01,0);
    } while( true );
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_190);
  poVar6 = std::operator<<(local_180,"Version ");
  piVar5 = Header::version((Header *)0x1ce950);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*piVar5);
  std::operator<<(poVar6," not supported for deeptiled images in this version of the library");
  pAVar7 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(pAVar7,local_190);
  __cxa_throw(pAVar7,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
DeepTiledInputFile::initialize ()
{
    if (_data->partNumber == -1)
        if (_data->header.type() != DEEPTILE)
            throw IEX_NAMESPACE::ArgExc ("Expected a deep tiled file but the file is not deep tiled.");
   if(_data->header.version()!=1)
   {
       THROW(IEX_NAMESPACE::ArgExc, "Version " << _data->header.version() << " not supported for deeptiled images in this version of the library");
   }
        
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
                          _data->minX, _data->maxX,
                          _data->minY, _data->maxY,
                          _data->numXTiles, _data->numYTiles,
                          _data->numXLevels, _data->numYLevels);

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
                                      _data->numXLevels,
                                      _data->numYLevels,
                                      _data->numXTiles,
                                      _data->numYTiles);

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
        _data->tileBuffers[i] = new TileBuffer ();

    _data->maxSampleCountTableSize = _data->tileDesc.ySize *
                                     _data->tileDesc.xSize *
                                     sizeof(int);

    _data->sampleCountTableBuffer.resizeErase(_data->maxSampleCountTableSize);

    _data->sampleCountTableComp = newCompressor(_data->header.compression(),
                                                _data->maxSampleCountTableSize,
                                                _data->header);
                                                
                                                
    const ChannelList & c=_data->header.channels();
    _data->combinedSampleSize=0;
    for(ChannelList::ConstIterator i=c.begin();i!=c.end();i++)
    {
        switch( i.channel().type )
        {
            case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF  :
                _data->combinedSampleSize+=Xdr::size<half>();
                break;
            case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT :
                _data->combinedSampleSize+=Xdr::size<float>();
                break;
            case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT  :
                _data->combinedSampleSize+=Xdr::size<unsigned int>();
                break;
            default :
                THROW(IEX_NAMESPACE::ArgExc, "Bad type for channel " << i.name() << " initializing deepscanline reader");
        }
    }
                                                  
}